

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *CreateInfo)

{
  IThreadPool *pThreadPool;
  pointer ppSVar1;
  undefined8 __p;
  IAsyncTask *pIVar2;
  IAsyncTask *pIVar3;
  pointer ppSVar4;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> Shaders;
  SHADER_TYPE ActiveShaderStages;
  TShaderStages ShaderStages;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
  StageShaders;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  local_2c8;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> local_2a8;
  undefined1 local_288 [24];
  IAsyncTask *pIStack_270;
  undefined8 local_268;
  anon_class_552_3_1ef41722_for_Handler local_258;
  
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_COMPILING;
  UNLOCK();
  if ((((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
       PSO_CREATE_FLAG_NONE) ||
     ((((this->
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        ).m_pDevice)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_pShaderCompilationThreadPool.
      m_pObject == (IThreadPool *)0x0)) {
    PipelineStateVkImpl::InitializePipeline((PipelineStateVkImpl *)this,CreateInfo);
    LOCK();
    (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
    UNLOCK();
  }
  else {
    local_288._16_8_ = (IAsyncTask *)0x0;
    pIStack_270 = (IAsyncTask *)0x0;
    local_268 = 0;
    local_288._12_4_ = 0;
    PipelineStateUtils::
    ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (CreateInfo,
               (vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                *)(local_288 + 0x10),false,(SHADER_TYPE *)(local_288 + 0xc));
    pIVar2 = pIStack_270;
    local_2a8.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((IAsyncTask *)local_288._16_8_ == pIStack_270) {
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
    }
    else {
      pIVar3 = (IAsyncTask *)local_288._16_8_;
      do {
        std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ::vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  *)&local_258,
                 (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  *)(pIVar3 + 1));
        std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Diligent::ShaderVkImpl_const**,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>>
                  ((vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>
                    *)&local_2a8,
                   local_2a8.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_258.pThisImpl,
                   local_258.Shaders.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if (local_258.pThisImpl != (PipelineStateImplType *)0x0) {
          operator_delete(local_258.pThisImpl,
                          (long)local_258.Shaders.
                                super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_258.pThisImpl);
        }
        ppSVar1 = local_2a8.
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar3 = pIVar3 + 7;
      } while (pIVar3 != pIVar2);
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
      local_2c8.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (RefCntAutoPtr<Diligent::IAsyncTask> *)0x0;
      if (local_2a8.
          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2a8.
          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppSVar4 = local_2a8.
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((((*ppSVar4)->super_ShaderBase<Diligent::EngineVkImplTraits>).m_AsyncInitializer._M_t.
               super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
               ._M_t.
               super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
               .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl !=
               (AsyncInitializer *)0x0) &&
             (AsyncInitializer::GetCompileTask((AsyncInitializer *)&local_258),
             local_258.pThisImpl != (PipelineStateImplType *)0x0)) {
            if (local_2c8.
                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_2c8.
                super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
              ::_M_realloc_insert<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                        ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                          *)&local_2c8,
                         (iterator)
                         local_2c8.
                         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (RefCntAutoPtr<Diligent::IAsyncTask> *)&local_258);
              if (local_258.pThisImpl != (PipelineStateImplType *)0x0) {
                (**(_func_int **)
                   ((long)((local_258.pThisImpl)->
                          super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                          .super_ObjectBase<Diligent::IPipelineStateVk>.
                          super_RefCountedObject<Diligent::IPipelineStateVk>.super_IPipelineStateVk.
                          super_IPipelineState.super_IDeviceObject + 0x10))();
              }
            }
            else {
              (local_2c8.
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_pObject =
                   (IAsyncTask *)local_258.pThisImpl;
              local_2c8.
              super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_2c8.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          ppSVar4 = ppSVar4 + 1;
        } while (ppSVar4 != ppSVar1);
      }
    }
    pThreadPool = (((this->
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    ).m_pDevice)->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                  m_pShaderCompilationThreadPool.m_pObject;
    local_258.pThisImpl = (PipelineStateImplType *)this;
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    vector(&local_258.Shaders,&local_2a8);
    RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
              (&local_258.CreateInfo,CreateInfo);
    AsyncInitializer::
    Start<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&)::_lambda(unsigned_int)_1_>
              ((AsyncInitializer *)local_288,pThreadPool,&local_2c8,&local_258);
    __p = local_288._0_8_;
    local_288._0_8_ =
         (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)&this->m_AsyncInitializer,(pointer)__p);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)local_288);
    RayTracingPipelineStateCreateInfoX::~RayTracingPipelineStateCreateInfoX(&local_258.CreateInfo);
    if (local_258.Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.Shaders.
                      super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.Shaders.
                            super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.Shaders.
                            super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector(&local_2c8);
    if (local_2a8.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.
                      super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a8.
                            super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.
                            super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ::~vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               *)(local_288 + 0x10));
  }
  return;
}

Assistant:

void Construct(const PSOCreateInfoType& CreateInfo)
    {
        PipelineStateImplType* const pThisImpl = static_cast<PipelineStateImplType*>(this);

        m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
        if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && this->m_pDevice->GetShaderCompilationThreadPool() != nullptr)
        {
            // Collect all asynchronous shader compile tasks
            typename PipelineStateImplType::TShaderStages ShaderStages;
            SHADER_TYPE                                   ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
            constexpr bool                                WaitUntilShadersReady = false;
            PipelineStateUtils::ExtractShaders<ShaderImplType>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

            std::vector<const ShaderImplType*> Shaders;
            for (const auto& Stage : ShaderStages)
            {
                std::vector<const ShaderImplType*> StageShaders = GetStageShaders(Stage);
                Shaders.insert(Shaders.end(), StageShaders.begin(), StageShaders.end());
            }

            std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
            for (const ShaderImplType* pShader : Shaders)
            {
                if (RefCntAutoPtr<IAsyncTask> pCompileTask = pShader->GetCompileTask())
                    ShaderCompileTasks.emplace_back(std::move(pCompileTask));
            }

            m_AsyncInitializer = AsyncInitializer::Start(
                this->m_pDevice->GetShaderCompilationThreadPool(),
                ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
                [pThisImpl,
#ifdef DILIGENT_DEBUG
                 Shaders,
#endif
                 CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo}](Uint32 ThreadId) mutable //
                {
#ifdef DILIGENT_DEBUG
                    for (const ShaderImplType* pShader : Shaders)
                    {
                        VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                        "prerequisites for the pipeline initialization task. This appears to be a bug.");
                    }
#endif
                    try
                    {
                        pThisImpl->InitializePipeline(CreateInfo);
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_READY);
                    }
                    catch (...)
                    {
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                    }

                    // Release create info objects
                    CreateInfo.Clear();
                });
        }
        else
        {
            try
            {
                pThisImpl->InitializePipeline(CreateInfo);
                m_Status.store(PIPELINE_STATE_STATUS_READY);
            }
            catch (...)
            {
                pThisImpl->Destruct();
                throw;
            }
        }
    }